

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Node::Which,capnp::schema::Node::Which&>&,char_const(&)[46],unsigned_long&,unsigned_int,unsigned_int,capnp::Text::Reader>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which_&> *params,
          char (*params_1) [46],unsigned_long *params_2,uint *params_3,uint *params_4,
          Reader *params_5)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined4 in_register_00000014;
  char (*params_00) [46];
  unsigned_long *params_01;
  uint *params_02;
  uint *params_03;
  Reader *params_04;
  long lVar4;
  String argValues [6];
  long *plVar5;
  undefined8 uVar6;
  long local_d8 [3];
  String local_c0;
  String local_a8;
  String local_90;
  String local_78;
  String local_60;
  long local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  this->exception = (Exception *)0x0;
  _::operator*(&local_48,params,CONCAT44(in_register_00000014,line));
  local_d8[0] = local_48;
  local_d8[1] = local_40;
  local_d8[2] = uStack_38;
  str<char_const(&)[46]>(&local_c0,(kj *)params_1,params_00);
  str<unsigned_long&>(&local_a8,(kj *)params_2,params_01);
  str<unsigned_int&>(&local_90,(kj *)params_3,params_02);
  str<unsigned_int&>(&local_78,(kj *)params_4,params_03);
  str<capnp::Text::Reader&>(&local_60,(kj *)params_5,params_04);
  plVar5 = local_d8;
  uVar6 = 6;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x78;
  do {
    lVar1 = *(long *)((long)local_d8 + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)local_d8 + lVar4 + 8);
      *(undefined8 *)((long)local_d8 + lVar4) = 0;
      *(undefined8 *)((long)local_d8 + lVar4 + 8) = 0;
      puVar3 = *(undefined8 **)((long)local_d8 + lVar4 + 0x10);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,plVar5,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}